

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqdebug.cpp
# Opt level: O0

void __thiscall
SQVM::Raise_ParamTypeError(SQVM *this,SQInteger nparam,SQInteger typemask,SQInteger type)

{
  SQString *pSVar1;
  SQChar *pSVar2;
  SQObjectType in_ECX;
  ulong in_RDX;
  SQObjectPtr *in_RSI;
  SQVM *in_RDI;
  SQInteger mask;
  SQInteger i;
  SQInteger found;
  SQObjectPtr exptypes;
  SQObjectPtr *in_stack_ffffffffffffff50;
  SQChar *in_stack_ffffffffffffff58;
  SQSharedState *in_stack_ffffffffffffff60;
  SQObjectPtr local_78 [2];
  SQObjectPtr local_58;
  ulong local_48;
  byte *dest;
  byte *obj;
  SQObjectPtr *in_stack_ffffffffffffffd0;
  SQObjectValue in_stack_ffffffffffffffd8;
  
  pSVar1 = SQString::Create(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                            (SQInteger)in_stack_ffffffffffffff50);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffffd0,pSVar1);
  obj = (byte *)0x0;
  for (dest = (byte *)0x0; (long)dest < 0x10; dest = dest + 1) {
    local_48 = 1L << ((byte)dest & 0x3f);
    if ((in_RDX & local_48) != 0) {
      if (0 < (long)obj) {
        pSVar1 = SQString::Create(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                                  (SQInteger)in_stack_ffffffffffffff50);
        ::SQObjectPtr::SQObjectPtr(&local_58,pSVar1);
        StringCat(in_stack_ffffffffffffffd8.pThread,in_stack_ffffffffffffffd0,(SQObjectPtr *)obj,
                  (SQObjectPtr *)dest);
        ::SQObjectPtr::~SQObjectPtr(in_stack_ffffffffffffff50);
      }
      obj = obj + 1;
      IdType2Name((SQObjectType)local_48);
      in_stack_ffffffffffffff60 =
           (SQSharedState *)
           SQString::Create(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                            (SQInteger)in_stack_ffffffffffffff50);
      ::SQObjectPtr::SQObjectPtr(local_78,(SQString *)in_stack_ffffffffffffff60);
      StringCat(in_stack_ffffffffffffffd8.pThread,in_stack_ffffffffffffffd0,(SQObjectPtr *)obj,
                (SQObjectPtr *)dest);
      ::SQObjectPtr::~SQObjectPtr(in_stack_ffffffffffffff50);
    }
  }
  pSVar2 = IdType2Name(in_ECX);
  Raise_Error(in_RDI,"parameter %d has an invalid type \'%s\' ; expected: \'%s\'",in_RSI,pSVar2,
              &(in_stack_ffffffffffffffd8.pTable)->_firstfree);
  ::SQObjectPtr::~SQObjectPtr(in_RSI);
  return;
}

Assistant:

void SQVM::Raise_ParamTypeError(SQInteger nparam,SQInteger typemask,SQInteger type)
{
    SQObjectPtr exptypes = SQString::Create(_ss(this), _SC(""), -1);
    SQInteger found = 0;
    for(SQInteger i=0; i<16; i++)
    {
        SQInteger mask = ((SQInteger)1) << i;
        if(typemask & (mask)) {
            if(found>0) StringCat(exptypes,SQString::Create(_ss(this), _SC("|"), -1), exptypes);
            found ++;
            StringCat(exptypes,SQString::Create(_ss(this), IdType2Name((SQObjectType)mask), -1), exptypes);
        }
    }
    Raise_Error(_SC("parameter %d has an invalid type '%s' ; expected: '%s'"), nparam, IdType2Name((SQObjectType)type), _stringval(exptypes));
}